

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O3

void unset_replace_list(dmr_C *C,symbol_list *list)

{
  void *pvVar1;
  char *pcVar2;
  undefined1 local_48 [8];
  ptr_list_iter symiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)list);
  pvVar1 = ptrlist_iter_next((ptr_list_iter *)local_48);
  if (pvVar1 != (void *)0x0) {
    do {
      if (*(long *)((long)pvVar1 + 0x28) == 0) {
        pcVar2 = dmrC_show_ident(C,*(ident **)((long)pvVar1 + 0x18));
        dmrC_warning(C,*(position *)((long)pvVar1 + 4),"symbol \'%s\' not replaced?",pcVar2);
      }
      else {
        *(undefined8 *)(*(long *)((long)pvVar1 + 0x28) + 0x28) = 0;
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
      }
      pvVar1 = ptrlist_iter_next((ptr_list_iter *)local_48);
    } while (pvVar1 != (void *)0x0);
  }
  return;
}

Assistant:

static void unset_replace_list(struct dmr_C *C, struct symbol_list *list)
{
	struct symbol *sym;
	FOR_EACH_PTR(list, sym) {
		unset_replace(C, sym);
	} END_FOR_EACH_PTR(sym);
}